

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O1

void __thiscall sptk::Matrix::Matrix(Matrix *this,Matrix *matrix)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  allocator_type local_19;
  
  this->_vptr_Matrix = (_func_int **)&PTR__Matrix_0010fd28;
  iVar1 = matrix->num_column_;
  this->num_row_ = matrix->num_row_;
  this->num_column_ = iVar1;
  std::vector<double,_std::allocator<double>_>::vector(&this->data_,&matrix->data_);
  std::vector<double_*,_std::allocator<double_*>_>::vector
            (&this->index_,(long)this->num_row_,&local_19);
  iVar1 = this->num_row_;
  if (0 < (long)iVar1) {
    iVar2 = this->num_column_;
    lVar3 = 0;
    lVar4 = 0;
    do {
      (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4] =
           (double *)
           ((long)(this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar3);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + (long)iVar2 * 8;
    } while (iVar1 != lVar4);
  }
  return;
}

Assistant:

Matrix::Matrix(const Matrix& matrix)
    : num_row_(matrix.num_row_),
      num_column_(matrix.num_column_),
      data_(matrix.data_),
      index_(num_row_) {
  for (int i(0); i < num_row_; ++i) {
    index_[i] = &data_[i * num_column_];
  }
}